

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_no_field_presence.pb.cc
# Opt level: O2

size_t __thiscall
proto2_nofieldpresence_unittest::TestAllMapTypes::ByteSizeLong(TestAllMapTypes *this)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  const_iterator __begin2;
  UntypedMapIterator local_30;
  
  uVar1 = _internal_map_int32_bytes_size(this);
  uVar4 = (ulong)uVar1;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,
             (UntypedMapBase *)
             &(this->field_0)._impl_.map_int32_bytes_.
              super_TypeDefinedMapFieldBase<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .field_0.map_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)12>
            ::ByteSizeLong((int *)(local_30.node_ + 1),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_30.node_ + 2));
    uVar4 = uVar4 + sVar2;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  uVar1 = _internal_map_int32_foreign_enum_size(this);
  lVar5 = uVar4 + uVar1;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_foreign_enum_);
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,
             (UntypedMapBase *)
             &(this->field_0)._impl_.map_int32_foreign_enum_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignEnum>.
              field_0.map_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignEnum,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)14>
            ::ByteSizeLong((int *)(local_30.node_ + 1),
                           (ForeignEnum *)((long)&local_30.node_[1].next + 4));
    lVar5 = lVar5 + sVar2;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  uVar1 = _internal_map_int32_foreign_message_size(this);
  lVar5 = lVar5 + (ulong)uVar1;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_foreign_message_);
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,
             (UntypedMapBase *)
             &(this->field_0)._impl_.map_int32_foreign_message_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ForeignMessage>.
              field_0.map_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar2 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((int *)(local_30.node_ + 1),(ForeignMessage *)(local_30.node_ + 2));
    lVar5 = lVar5 + sVar2;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  uVar1 = _internal_map_int32_explicit_foreign_message_size(this);
  sVar2 = lVar5 + (ulong)uVar1;
  google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
            ((MapFieldBase *)&(this->field_0)._impl_.map_int32_explicit_foreign_message_);
  google::protobuf::internal::UntypedMapBase::begin
            (&local_30,
             (UntypedMapBase *)
             &(this->field_0)._impl_.map_int32_explicit_foreign_message_.
              super_TypeDefinedMapFieldBase<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage>
              .field_0.map_);
  while (local_30.node_ != (NodeBase *)0x0) {
    sVar3 = google::protobuf::internal::
            MapEntryFuncs<int,_proto2_nofieldpresence_unittest::ExplicitForeignMessage,_(google::protobuf::internal::WireFormatLite::FieldType)5,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong((int *)(local_30.node_ + 1),
                           (ExplicitForeignMessage *)(local_30.node_ + 2));
    sVar2 = sVar2 + sVar3;
    google::protobuf::internal::UntypedMapIterator::PlusPlus(&local_30);
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar2,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestAllMapTypes::ByteSizeLong() const {
  const TestAllMapTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_nofieldpresence_unittest.TestAllMapTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // map<int32, bytes> map_int32_bytes = 1;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_bytes_size());
      for (const auto& entry : this_._internal_map_int32_bytes()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, std::string,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_BYTES>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignEnum> map_int32_foreign_enum = 2;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_enum_size());
      for (const auto& entry : this_._internal_map_int32_foreign_enum()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignEnum,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_ENUM>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ForeignMessage> map_int32_foreign_message = 3;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
    // map<int32, .proto2_nofieldpresence_unittest.ExplicitForeignMessage> map_int32_explicit_foreign_message = 4;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_map_int32_explicit_foreign_message_size());
      for (const auto& entry : this_._internal_map_int32_explicit_foreign_message()) {
        total_size += _pbi::MapEntryFuncs<::int32_t, ::proto2_nofieldpresence_unittest::ExplicitForeignMessage,
                                       _pbi::WireFormatLite::TYPE_INT32,
                                       _pbi::WireFormatLite::TYPE_MESSAGE>::ByteSizeLong(entry.first, entry.second);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}